

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDBoard.cpp
# Opt level: O0

void __thiscall BRDBoard::BRDBoard(BRDBoard *this,BRDFileBase *boardFile)

{
  uint uVar1;
  BRDPartType BVar2;
  EBoardSide EVar3;
  char *pcVar4;
  bool bVar5;
  element_type *peVar6;
  string *psVar7;
  element_type *peVar8;
  size_type sVar9;
  element_type *peVar10;
  element_type *peVar11;
  size_type sVar12;
  __shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  element_type *peVar14;
  ulong uVar15;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  __first;
  iterator iVar16;
  iterator iVar17;
  _func_int **in_RSI;
  Board *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>
  *net_2;
  iterator __end1_3;
  iterator __begin1_3;
  SharedStringMap<Net> *__range1_3;
  shared_ptr<Net> net_1;
  string net_name;
  shared_ptr<Pin> pin;
  shared_ptr<Component> comp_1;
  BRDPin *brd_pin;
  size_t i;
  vector<BRDPart,_std::allocator<BRDPart>_> parts;
  vector<BRDPin,_std::allocator<BRDPin>_> pins;
  uint part_idx;
  uint pin_idx;
  shared_ptr<Component> comp_dummy;
  shared_ptr<Component> comp;
  BRDPart *brd_part;
  iterator __end1_2;
  iterator __begin1_2;
  vector<BRDPart,_std::allocator<BRDPart>_> *__range1_2;
  shared_ptr<Net> net;
  BRDNail *brd_nail;
  iterator __end1_1;
  iterator __begin1_1;
  vector<BRDNail,_std::allocator<BRDNail>_> *__range1_1;
  shared_ptr<Net> net_nc;
  SharedStringMap<Net> net_map;
  shared_ptr<Point> point;
  BRDPoint *brdPoint;
  iterator __end1;
  iterator __begin1;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *__range1;
  vector<BRDPoint,_std::allocator<BRDPoint>_> m_points;
  vector<BRDNail,_std::allocator<BRDNail>_> m_nails;
  vector<BRDPin,_std::allocator<BRDPin>_> m_pins;
  vector<BRDPart,_std::allocator<BRDPart>_> m_parts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
  *in_stack_fffffffffffff9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b0;
  key_type *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  byte in_stack_fffffffffffff9c4;
  undefined1 in_stack_fffffffffffff9c5;
  undefined1 in_stack_fffffffffffff9c6;
  undefined1 in_stack_fffffffffffff9c7;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_fffffffffffff9c8;
  vector<BRDNail,_std::allocator<BRDNail>_> *in_stack_fffffffffffff9d0;
  int *in_stack_fffffffffffff9d8;
  allocator<char> *in_stack_fffffffffffff9e0;
  key_type *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  float in_stack_fffffffffffff9fc;
  vector<BRDPart,_std::allocator<BRDPart>_> *in_stack_fffffffffffffa00;
  vector<BRDNail,_std::allocator<BRDNail>_> *in_stack_fffffffffffffa48;
  vector<BRDNail,_std::allocator<BRDNail>_> *in_stack_fffffffffffffa50;
  _Self local_418;
  _Self local_410;
  undefined1 *local_408;
  shared_ptr<Component> *local_400;
  shared_ptr<Component> *local_3f8;
  shared_ptr<Component> *local_3e0;
  shared_ptr<Component> *local_3d8;
  shared_ptr<Component> *local_3d0;
  __shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2> local_3c0;
  string local_3b0 [32];
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [36];
  Point local_344;
  allocator<char> local_339;
  string local_338 [32];
  string local_318 [48];
  __shared_ptr local_2e8 [16];
  reference local_2d8;
  ulong local_2d0;
  vector<BRDPin,_std::allocator<BRDPin>_> local_2b0;
  uint local_298;
  int local_294;
  string local_280 [32];
  string local_260 [36];
  Point local_23c;
  Point local_234;
  allocator<char> local_229;
  string local_228 [48];
  reference local_1f8;
  BRDPart *local_1f0;
  __normal_iterator<BRDPart_*,_std::vector<BRDPart,_std::allocator<BRDPart>_>_> local_1e8;
  undefined1 *local_1e0;
  undefined4 local_1d4;
  string local_1d0 [32];
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [48];
  reference local_158;
  BRDNail *local_150;
  __normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_> local_148;
  undefined1 *local_140;
  undefined1 local_128 [48];
  vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *local_f8;
  vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *local_e8;
  pair<BRDPoint,_BRDPoint> *local_e0;
  pair<BRDPoint,_BRDPoint> *local_d8;
  reference local_c0;
  BRDPoint *local_b8;
  __normal_iterator<BRDPoint_*,_std::vector<BRDPoint,_std::allocator<BRDPoint>_>_> local_b0;
  undefined1 *local_a8;
  undefined1 local_98 [32];
  undefined1 local_78 [80];
  undefined1 local_28 [24];
  _func_int **local_10;
  
  local_10 = in_RSI;
  Board::Board(in_RDI);
  in_RDI->_vptr_Board = (_func_int **)&PTR__BRDBoard_00302af8;
  in_RDI[1]._vptr_Board = local_10;
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::vector
            ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)0x14637b);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
            ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             0x146394);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::vector
            ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)0x1463ad);
  std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::vector
            ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)0x1463c6);
  std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::vector
            ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)0x1463df)
  ;
  std::allocator<BRDPart>::allocator((allocator<BRDPart> *)0x14640b);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector
            ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffff9d0,
             (size_type)in_stack_fffffffffffff9c8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::allocator<BRDPart>::~allocator((allocator<BRDPart> *)0x146437);
  std::allocator<BRDPin>::allocator((allocator<BRDPin> *)0x146463);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
            ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffff9d0,
             (size_type)in_stack_fffffffffffff9c8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::allocator<BRDPin>::~allocator((allocator<BRDPin> *)0x14648f);
  std::allocator<BRDNail>::allocator((allocator<BRDNail> *)0x1464bb);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::vector
            (in_stack_fffffffffffff9d0,(size_type)in_stack_fffffffffffff9c8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::allocator<BRDNail>::~allocator((allocator<BRDNail> *)0x1464e7);
  std::allocator<BRDPoint>::allocator((allocator<BRDPoint> *)0x146513);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::vector
            ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffff9d0,
             (size_type)in_stack_fffffffffffff9c8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::allocator<BRDPoint>::~allocator((allocator<BRDPoint> *)0x14653f);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::operator=
            ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffffa50,
             (vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffffa48);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::operator=
            ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffffa50,
             (vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffffa48);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::operator=
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::operator=
            ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffffa50,
             (vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffffa48);
  local_a8 = local_98;
  local_b0._M_current =
       (BRDPoint *)
       std::vector<BRDPoint,_std::allocator<BRDPoint>_>::begin
                 ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffff9a8);
  local_b8 = (BRDPoint *)
             std::vector<BRDPoint,_std::allocator<BRDPoint>_>::end
                       ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffff9a8);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<BRDPoint_*,_std::vector<BRDPoint,_std::allocator<BRDPoint>_>_>
                             *)in_stack_fffffffffffff9b0,
                            (__normal_iterator<BRDPoint_*,_std::vector<BRDPoint,_std::allocator<BRDPoint>_>_>
                             *)in_stack_fffffffffffff9a8), bVar5) {
    local_c0 = __gnu_cxx::
               __normal_iterator<BRDPoint_*,_std::vector<BRDPoint,_std::allocator<BRDPoint>_>_>::
               operator*(&local_b0);
    std::make_shared<Point,int&,int&>(in_stack_fffffffffffff9d8,(int *)in_stack_fffffffffffff9d0);
    std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::push_back
              ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
               CONCAT17(in_stack_fffffffffffff9c7,
                        CONCAT16(in_stack_fffffffffffff9c6,
                                 CONCAT15(in_stack_fffffffffffff9c5,
                                          CONCAT14(in_stack_fffffffffffff9c4,
                                                   in_stack_fffffffffffff9c0)))),
               (value_type *)in_stack_fffffffffffff9b8);
    std::shared_ptr<Point>::~shared_ptr((shared_ptr<Point> *)0x14666e);
    __gnu_cxx::__normal_iterator<BRDPoint_*,_std::vector<BRDPoint,_std::allocator<BRDPoint>_>_>::
    operator++(&local_b0);
  }
  std::vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>::size
            ((vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
              *)(in_RDI[1]._vptr_Board + 6));
  std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::reserve
            ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)
             in_stack_fffffffffffff9e0,(size_type)in_stack_fffffffffffff9d8);
  local_d8 = (pair<BRDPoint,_BRDPoint> *)
             std::
             vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
             ::begin((vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                      *)in_stack_fffffffffffff9a8);
  local_e0 = (pair<BRDPoint,_BRDPoint> *)
             std::
             vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
             ::end((vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                    *)in_stack_fffffffffffff9a8);
  local_e8 = (vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)
             std::
             back_inserter<std::vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>>>
                       ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>
                         *)in_stack_fffffffffffff9a8);
  local_f8 = (vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)
             std::
             transform<__gnu_cxx::__normal_iterator<std::pair<BRDPoint,BRDPoint>const*,std::vector<std::pair<BRDPoint,BRDPoint>,std::allocator<std::pair<BRDPoint,BRDPoint>>>>,std::back_insert_iterator<std::vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>>>,BRDBoard::BRDBoard(BRDFileBase_const*)::__0>
                       (local_d8,local_e0,local_e8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
         *)0x146839);
  std::make_shared<Net>();
  peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x146855
                     );
  std::__cxx11::string::operator=
            ((string *)&peVar6->name,(string *)&kNetUnconnectedPrefix_abi_cxx11_);
  peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x14687f
                     );
  peVar6->is_ground = false;
  std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x146890);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  std::shared_ptr<Net>::operator=
            ((shared_ptr<Net> *)in_stack_fffffffffffff9b0,
             (shared_ptr<Net> *)in_stack_fffffffffffff9a8);
  local_140 = local_78;
  local_148._M_current =
       (BRDNail *)
       std::vector<BRDNail,_std::allocator<BRDNail>_>::begin
                 ((vector<BRDNail,_std::allocator<BRDNail>_> *)in_stack_fffffffffffff9a8);
  local_150 = (BRDNail *)
              std::vector<BRDNail,_std::allocator<BRDNail>_>::end
                        ((vector<BRDNail,_std::allocator<BRDNail>_> *)in_stack_fffffffffffff9a8);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>
                             *)in_stack_fffffffffffff9b0,
                            (__normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>
                             *)in_stack_fffffffffffff9a8), bVar5) {
    local_158 = __gnu_cxx::
                __normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>::
                operator*(&local_148);
    std::make_shared<Net>();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0
              );
    peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x146994);
    std::__cxx11::string::operator=((string *)&peVar6->name,local_188);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    std::__cxx11::string::string(local_1b0,(string *)&kNetUnconnectedPrefix_abi_cxx11_);
    peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1469ed);
    std::__cxx11::string::string(local_1d0,(string *)&peVar6->name);
    bVar5 = is_prefix((string *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                      in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1b0);
    if (bVar5) {
      local_1d4 = 5;
    }
    else {
      uVar1 = local_158->probe;
      peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x146b33);
      *(uint *)&(peVar6->super_BoardElement).field_0xc = uVar1;
      if (local_158->side == Top) {
        peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x146b58);
        (peVar6->super_BoardElement).board_side = kBoardSideTop;
      }
      else {
        peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x146b6e);
        (peVar6->super_BoardElement).board_side = kBoardSideBottom;
      }
      std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x146b82);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                    *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      std::shared_ptr<Net>::operator=
                ((shared_ptr<Net> *)in_stack_fffffffffffff9b0,
                 (shared_ptr<Net> *)in_stack_fffffffffffff9a8);
      local_1d4 = 0;
    }
    std::shared_ptr<Net>::~shared_ptr((shared_ptr<Net> *)0x146bcd);
    __gnu_cxx::__normal_iterator<BRDNail_*,_std::vector<BRDNail,_std::allocator<BRDNail>_>_>::
    operator++(&local_148);
  }
  std::shared_ptr<Net>::~shared_ptr((shared_ptr<Net> *)0x146c0f);
  local_1e0 = local_28;
  local_1e8._M_current =
       (BRDPart *)
       std::vector<BRDPart,_std::allocator<BRDPart>_>::begin
                 ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffff9a8);
  local_1f0 = (BRDPart *)
              std::vector<BRDPart,_std::allocator<BRDPart>_>::end
                        ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffff9a8);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<BRDPart_*,_std::vector<BRDPart,_std::allocator<BRDPart>_>_>
                             *)in_stack_fffffffffffff9b0,
                            (__normal_iterator<BRDPart_*,_std::vector<BRDPart,_std::allocator<BRDPart>_>_>
                             *)in_stack_fffffffffffff9a8), bVar5) {
    local_1f8 = __gnu_cxx::
                __normal_iterator<BRDPart_*,_std::vector<BRDPart,_std::allocator<BRDPart>_>_>::
                operator*(&local_1e8);
    std::make_shared<Component>();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0
              );
    peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x146ce7);
    std::__cxx11::string::operator=((string *)&peVar8->name,local_228);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator(&local_229);
    psVar7 = &local_1f8->mfgcode;
    peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x146d3e);
    std::__cxx11::string::operator=((string *)&peVar8->mfgcode,(string *)psVar7);
    Point::Point(&local_234,(local_1f8->p1).x,(local_1f8->p1).y);
    peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x146d7c);
    peVar8->p1 = local_234;
    Point::Point(&local_23c,(local_1f8->p2).x,(local_1f8->p2).y);
    peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x146db5);
    peVar8->p2 = local_23c;
    std::__cxx11::string::string(local_260,(string *)&kComponentDummyName_abi_cxx11_);
    peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x146de7);
    std::__cxx11::string::string(local_280,(string *)&peVar8->name);
    bVar5 = is_prefix((string *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                      in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_260);
    if (bVar5) {
      peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x146e52);
      peVar8->component_type = kComponentTypeDummy;
    }
    if (local_1f8->mounting_side == Top) {
      peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x146f13);
      (peVar8->super_BoardElement).board_side = kBoardSideTop;
    }
    else if (local_1f8->mounting_side == Bottom) {
      peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x146f37);
      (peVar8->super_BoardElement).board_side = kBoardSideBottom;
    }
    else {
      peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x146f4d);
      (peVar8->super_BoardElement).board_side = kBoardSideBoth;
    }
    BVar2 = local_1f8->part_type;
    peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x146f88);
    *(uint *)&(peVar8->super_BoardElement).field_0xc = 2 - (uint)(BVar2 == SMD);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::push_back
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT17(in_stack_fffffffffffff9c7,
                        CONCAT16(in_stack_fffffffffffff9c6,
                                 CONCAT15(in_stack_fffffffffffff9c5,
                                          CONCAT14(in_stack_fffffffffffff9c4,
                                                   in_stack_fffffffffffff9c0)))),
               (value_type *)in_stack_fffffffffffff9b8);
    std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x146fba);
    __gnu_cxx::__normal_iterator<BRDPart_*,_std::vector<BRDPart,_std::allocator<BRDPart>_>_>::
    operator++(&local_1e8);
  }
  std::make_shared<Component>();
  peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x146ffa);
  std::__cxx11::string::operator=((string *)&peVar8->name,(string *)&kComponentDummyName_abi_cxx11_)
  ;
  peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x14701c);
  peVar8->component_type = kComponentTypeDummy;
  local_294 = 0;
  local_298 = 1;
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
            ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffffa00,
             (vector<BRDPin,_std::allocator<BRDPin>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector
            (in_stack_fffffffffffffa00,
             (vector<BRDPart,_std::allocator<BRDPart>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  for (local_2d0 = 0; uVar15 = local_2d0,
      sVar9 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size(&local_2b0), uVar15 < sVar9;
      local_2d0 = local_2d0 + 1) {
    local_2d8 = std::vector<BRDPin,_std::allocator<BRDPin>_>::operator[](&local_2b0,local_2d0);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
    operator[]((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               (in_RDI + 5),(ulong)(local_2d8->part - 1));
    std::shared_ptr<Component>::shared_ptr
              ((shared_ptr<Component> *)in_stack_fffffffffffff9b0,
               (shared_ptr<Component> *)in_stack_fffffffffffff9a8);
    bVar5 = std::__shared_ptr::operator_cast_to_bool(local_2e8);
    if (bVar5) {
      std::make_shared<Pin>();
      peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x147163);
      bVar5 = Component::is_dummy(peVar8);
      if (bVar5) {
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x147199);
        *(undefined4 *)&(peVar10->super_BoardElement).field_0xc = 4;
        std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1471ad);
        std::shared_ptr<Component>::operator=
                  ((shared_ptr<Component> *)in_stack_fffffffffffff9b0,
                   (shared_ptr<Component> *)in_stack_fffffffffffff9a8);
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1471d6);
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                   CONCAT17(in_stack_fffffffffffff9c7,
                            CONCAT16(in_stack_fffffffffffff9c6,
                                     CONCAT15(in_stack_fffffffffffff9c5,
                                              CONCAT14(in_stack_fffffffffffff9c4,
                                                       in_stack_fffffffffffff9c0)))),
                   (value_type *)in_stack_fffffffffffff9b8);
      }
      else {
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x147238);
        *(undefined4 *)&(peVar10->super_BoardElement).field_0xc = 2;
        std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x14724c);
        std::shared_ptr<Component>::operator=
                  ((shared_ptr<Component> *)in_stack_fffffffffffff9b0,
                   (shared_ptr<Component> *)in_stack_fffffffffffff9a8);
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x147275);
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                   CONCAT17(in_stack_fffffffffffff9c7,
                            CONCAT16(in_stack_fffffffffffff9c6,
                                     CONCAT15(in_stack_fffffffffffff9c5,
                                              CONCAT14(in_stack_fffffffffffff9c4,
                                                       in_stack_fffffffffffff9c0)))),
                   (value_type *)in_stack_fffffffffffff9b8);
      }
      local_294 = local_294 + 1;
      if (local_2d8->part != local_298) {
        local_298 = local_2d8->part;
        local_294 = 1;
      }
      if (local_2d8->snum == (char *)0x0) {
        std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x14733a);
        std::__cxx11::string::operator=((string *)&peVar10->number,local_318);
        std::__cxx11::string::~string(local_318);
      }
      else {
        pcVar4 = local_2d8->snum;
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x1472ff);
        std::__cxx11::string::operator=((string *)&peVar10->number,pcVar4);
      }
      if (local_2d8->name == (char *)0x0) {
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x14742e);
        peVar11 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x147447);
        std::__cxx11::string::operator=((string *)&peVar11->name,(string *)&peVar10->number);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                   in_stack_fffffffffffff9e0);
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x1473c3);
        std::__cxx11::string::operator=((string *)&peVar10->name,local_338);
        std::__cxx11::string::~string(local_338);
        std::allocator<char>::~allocator(&local_339);
      }
      Point::Point(&local_344,(local_2d8->pos).x,(local_2d8->pos).y);
      peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           0x147488);
      peVar10->position = local_344;
      if (local_2d8->side == Top) {
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x1474af);
        (peVar10->super_BoardElement).board_side = kBoardSideTop;
      }
      else if (local_2d8->side == Bottom) {
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x1474d3);
        (peVar10->super_BoardElement).board_side = kBoardSideBottom;
      }
      else {
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x1474e9);
        (peVar10->super_BoardElement).board_side = kBoardSideBoth;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                 in_stack_fffffffffffff9e0);
      std::allocator<char>::~allocator(&local_369);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff9c7,
                                   CONCAT16(in_stack_fffffffffffff9c6,
                                            CONCAT15(in_stack_fffffffffffff9c5,
                                                     CONCAT14(in_stack_fffffffffffff9c4,
                                                              in_stack_fffffffffffff9c0)))),
                       in_stack_fffffffffffff9b8);
      if (sVar12 == 0) {
        uVar15 = std::__cxx11::string::empty();
        if ((uVar15 & 1) == 0) {
          std::__cxx11::string::string(local_390,(string *)&kNetUnconnectedPrefix_abi_cxx11_);
          std::__cxx11::string::string(local_3b0,local_368);
          bVar5 = is_prefix((string *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                            in_stack_fffffffffffff9f0);
          std::__cxx11::string::~string(local_3b0);
          std::__cxx11::string::~string(local_390);
          if (bVar5) {
            p_Var13 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                     *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8)->
                       super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>;
            peVar14 = std::__shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>::get(p_Var13);
            peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1476d3);
            peVar10->net = peVar14;
            peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1476ec);
            *(undefined4 *)&(peVar10->super_BoardElement).field_0xc = 1;
          }
          else {
            std::make_shared<Net>();
            peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x14775d);
            std::__cxx11::string::operator=((string *)&peVar6->name,local_368);
            peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x147780);
            EVar3 = (peVar10->super_BoardElement).board_side;
            peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x147794);
            (peVar6->super_BoardElement).board_side = EVar3;
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                          *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
            std::shared_ptr<Net>::operator=
                      ((shared_ptr<Net> *)in_stack_fffffffffffff9b0,
                       (shared_ptr<Net> *)in_stack_fffffffffffff9a8);
            peVar14 = std::__shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>::get(&local_3c0);
            peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1477ee);
            peVar10->net = peVar14;
            std::shared_ptr<Net>::~shared_ptr((shared_ptr<Net> *)0x147804);
          }
        }
        else {
          p_Var13 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                   *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8)->
                     super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>;
          peVar14 = std::__shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>::get(p_Var13);
          peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                               )0x147865);
          peVar10->net = peVar14;
          peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                               )0x14787b);
          *(undefined4 *)&(peVar10->super_BoardElement).field_0xc = 1;
        }
      }
      else {
        p_Var13 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                 *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8)->
                   super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>;
        peVar14 = std::__shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>::get(p_Var13);
        peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x1475b9);
        peVar10->net = peVar14;
      }
      in_stack_fffffffffffff9fc = (float)local_2d8->radius;
      peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           0x1478ad);
      peVar10->diameter = in_stack_fffffffffffff9fc;
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1478c2);
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,
                                   CONCAT15(in_stack_fffffffffffff9c5,
                                            CONCAT14(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0)))),
                 (value_type *)in_stack_fffffffffffff9b8);
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                 CONCAT17(in_stack_fffffffffffff9c7,
                          CONCAT16(in_stack_fffffffffffff9c6,
                                   CONCAT15(in_stack_fffffffffffff9c5,
                                            CONCAT14(in_stack_fffffffffffff9c4,
                                                     in_stack_fffffffffffff9c0)))),
                 (value_type *)in_stack_fffffffffffff9b8);
      std::__cxx11::string::~string(local_368);
      std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x14790b);
      local_1d4 = 0;
    }
    else {
      local_1d4 = 10;
    }
    std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x147923);
  }
  local_3d8 = (shared_ptr<Component> *)
              std::
              begin<std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>
                        ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                          *)in_stack_fffffffffffff9a8);
  local_3e0 = (shared_ptr<Component> *)
              std::
              end<std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>
                        ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                          *)in_stack_fffffffffffff9a8);
  __first = std::
            remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,BRDBoard::BRDBoard(BRDFileBase_const*)::__1>
                      (local_3d8,local_3e0);
  local_3d0 = (shared_ptr<Component> *)__first;
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Component>const*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>
  ::__normal_iterator<std::shared_ptr<Component>*>
            ((__normal_iterator<const_std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
              *)in_stack_fffffffffffff9b0,
             (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
              *)in_stack_fffffffffffff9a8);
  iVar16 = std::
           end<std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>
                     ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)in_stack_fffffffffffff9a8);
  local_3f8 = (shared_ptr<Component> *)iVar16;
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Component>const*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>
  ::__normal_iterator<std::shared_ptr<Component>*>
            ((__normal_iterator<const_std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
              *)in_stack_fffffffffffff9b0,
             (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
              *)in_stack_fffffffffffff9a8);
  local_400 = (shared_ptr<Component> *)
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::erase(in_stack_fffffffffffff9c8,(const_iterator)__first._M_current,
                      (const_iterator)iVar16._M_current);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::push_back
            ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))),(value_type *)in_stack_fffffffffffff9b8);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector
            ((vector<BRDPart,_std::allocator<BRDPart>_> *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::vector<BRDPin,_std::allocator<BRDPin>_>::~vector
            ((vector<BRDPin,_std::allocator<BRDPin>_> *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x147ab0);
  local_408 = local_128;
  local_410._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
       ::begin(in_stack_fffffffffffff9a8);
  local_418._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
       ::end(in_stack_fffffffffffff9a8);
  while (bVar5 = std::operator!=(&local_410,&local_418), bVar5) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>
                 *)0x147b15);
    std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x147b2e);
    in_stack_fffffffffffff9c7 =
         std::operator==(in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9c4 = true;
    if (!(bool)in_stack_fffffffffffff9c7) {
      std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x147b69);
      in_stack_fffffffffffff9c5 =
           std::operator==(in_stack_fffffffffffff9b0,(char *)in_stack_fffffffffffff9a8);
      in_stack_fffffffffffff9c4 = in_stack_fffffffffffff9c5;
    }
    in_stack_fffffffffffff9c6 = in_stack_fffffffffffff9c4;
    peVar6 = std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x147ba5);
    peVar6->is_ground = (bool)(in_stack_fffffffffffff9c4 & 1);
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::push_back
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
               CONCAT17(in_stack_fffffffffffff9c7,
                        CONCAT16(in_stack_fffffffffffff9c6,
                                 CONCAT15(in_stack_fffffffffffff9c5,
                                          CONCAT14(in_stack_fffffffffffff9c4,
                                                   in_stack_fffffffffffff9c0)))),
               (value_type *)in_stack_fffffffffffff9b8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>
                  *)in_stack_fffffffffffff9b0);
  }
  iVar16 = std::
           begin<std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>
                     ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)in_stack_fffffffffffff9a8);
  iVar17 = std::
           end<std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>
                     ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)in_stack_fffffffffffff9a8);
  std::
  sort<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,BRDBoard::BRDBoard(BRDFileBase_const*)::__2>
            (iVar16._M_current,iVar17._M_current);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
          *)0x147c90);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::~vector
            ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::vector<BRDNail,_std::allocator<BRDNail>_>::~vector
            ((vector<BRDNail,_std::allocator<BRDNail>_> *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::vector<BRDPin,_std::allocator<BRDPin>_>::~vector
            ((vector<BRDPin,_std::allocator<BRDPin>_> *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector
            ((vector<BRDPart,_std::allocator<BRDPart>_> *)
             CONCAT17(in_stack_fffffffffffff9c7,
                      CONCAT16(in_stack_fffffffffffff9c6,
                               CONCAT15(in_stack_fffffffffffff9c5,
                                        CONCAT14(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0
                                                )))));
  return;
}

Assistant:

BRDBoard::BRDBoard(const BRDFileBase * const boardFile)
    : m_file(boardFile) {
	// TODO: strip / trim all strings, especially those used as keys
	// TODO: just loop through original arrays?
	std::vector<BRDPart> m_parts(m_file->num_parts);
	std::vector<BRDPin> m_pins(m_file->num_pins);
	std::vector<BRDNail> m_nails(m_file->num_nails);
	std::vector<BRDPoint> m_points(m_file->num_format);

	m_parts  = m_file->parts;
	m_pins   = m_file->pins;
	m_nails  = m_file->nails;
	m_points = m_file->format;

	// Set outline
	{
		for (auto &brdPoint : m_points) {
			auto point = std::make_shared<Point>(brdPoint.x, brdPoint.y);
			outline_points_.push_back(point);
		}
	}

	outline_segments_.reserve(m_file->outline_segments.size());
	std::transform(m_file->outline_segments.begin(), m_file->outline_segments.end(), std::back_inserter(outline_segments_), [](const std::pair<BRDPoint, BRDPoint> &s) -> std::pair<Point, Point> {
		return {{s.first.x, s.first.y}, {s.second.x, s.second.y}};
	});

	// Populate map of unique nets
	SharedStringMap<Net> net_map;
	{
		// adding special net 'UNCONNECTED'
		auto net_nc           = std::make_shared<Net>();
		net_nc->name          = kNetUnconnectedPrefix;
		net_nc->is_ground     = false;
		net_map[net_nc->name] = net_nc;

		// handle all the others
		for (auto &brd_nail : m_nails) {
			auto net = std::make_shared<Net>();

			// copy NET name and number (probe)
			net->name = std::string(brd_nail.net);

			// avoid having multiple UNCONNECTED<XXX> references
			if (is_prefix(kNetUnconnectedPrefix, net->name)) continue;

			net->number    = brd_nail.probe;

			if (brd_nail.side == BRDPartMountingSide::Top) {
				net->board_side = kBoardSideTop;
			} else {
				net->board_side = kBoardSideBottom;
			}

			// so we can find nets later by name (making unique by name)
			net_map[net->name] = net;
		}
	}

	// Populate parts
	{
		for (auto &brd_part : m_parts) {
			auto comp = std::make_shared<Component>();

			comp->name    = std::string(brd_part.name);
			comp->mfgcode = std::move(brd_part.mfgcode);

			comp->p1 = {brd_part.p1.x, brd_part.p1.y};
			comp->p2 = {brd_part.p2.x, brd_part.p2.y};

			// is it some dummy component to indicate test pads?
			if (is_prefix(kComponentDummyName, comp->name)) comp->component_type = Component::kComponentTypeDummy;

			// check what side the board is on (sorcery?)
			if (brd_part.mounting_side == BRDPartMountingSide::Top) {
				comp->board_side = kBoardSideTop;
			} else if (brd_part.mounting_side == BRDPartMountingSide::Bottom) {
				comp->board_side = kBoardSideBottom;
			} else {
				comp->board_side = kBoardSideBoth;
			}

			comp->mount_type = (brd_part.part_type == BRDPartType::SMD) ? Component::kMountTypeSMD : Component::kMountTypeDIP;

			components_.push_back(comp);
		}
	}

	// Populate pins
	{
		// generate dummy component as reference
		auto comp_dummy            = std::make_shared<Component>();
		comp_dummy->name           = kComponentDummyName;
		comp_dummy->component_type = Component::kComponentTypeDummy;

		// NOTE: originally the pin diameter depended on part.name[0] == 'U' ?
		unsigned int pin_idx  = 0;
		unsigned int part_idx = 1;
		auto pins             = m_pins;
		auto parts            = m_parts;

		for (size_t i = 0; i < pins.size(); i++) {
			// (originally from BoardView::DrawPins)
			const BRDPin &brd_pin = pins[i];
			std::shared_ptr<Component> comp       = components_[brd_pin.part - 1];

			if (!comp) continue;

			auto pin = std::make_shared<Pin>();

			if (comp->is_dummy()) {
				// component is virtual, i.e. "...", pin is test pad
				pin->type      = Pin::kPinTypeTestPad;
				pin->component = comp_dummy;
				comp_dummy->pins.push_back(pin);
			} else {
				// component is regular / not virtual
				pin->type       = Pin::kPinTypeComponent;
				pin->component  = comp;
				comp->pins.push_back(pin);
			}

			// determine pin number on part
			++pin_idx;
			if (brd_pin.part != part_idx) {
				part_idx = brd_pin.part;
				pin_idx  = 1;
			}
			if (brd_pin.snum) {
				pin->number = brd_pin.snum;
			} else {
				pin->number = std::to_string(pin_idx);
			}

			// Lets us see BGA pad names finally
			//
			if (brd_pin.name) {
				pin->name = std::string(brd_pin.name);
			} else {
				pin->name = pin->number;
			}

			// copy position
			pin->position = Point(brd_pin.pos.x, brd_pin.pos.y);

			// Set board side for pins from specific setting
			if (brd_pin.side == BRDPinSide::Top) {
				pin->board_side = kBoardSideTop;
			} else if (brd_pin.side == BRDPinSide::Bottom) {
				pin->board_side = kBoardSideBottom;
			} else {
				pin->board_side = kBoardSideBoth;
			}

			// set net reference (here's our NET key string again)
			std::string net_name = std::string(brd_pin.net);
			if (net_map.count(net_name)) {
				// there is a net with that name in our map
				pin->net = net_map[net_name].get();
			} else {
				// no net with that name registered, so create one
				if (!net_name.empty()) {
					if (is_prefix(kNetUnconnectedPrefix, net_name)) {
						// pin is unconnected, so reference our special net
						pin->net  = net_map[kNetUnconnectedPrefix].get();
						pin->type = Pin::kPinTypeNotConnected;
					} else {
						// indeed a new net
						auto net        = std::make_shared<Net>();
						net->name       = net_name;
						net->board_side = pin->board_side;
						// NOTE: net->number not set
						net_map[net_name] = net;
						pin->net          = net.get();
					}
				} else {
					// not sure this can happen -> no info
					// It does happen in .fz apparently and produces a SEGFAULT… Use
					// unconnected net.
					pin->net  = net_map[kNetUnconnectedPrefix].get();
					pin->type = Pin::kPinTypeNotConnected;
				}
			}

			// TODO: should either depend on file specs or type etc
			//
			//  if(brd_pin.radius) pin->diameter = brd_pin.radius; // some format
			//  (.fz) contains a radius field
			//    else pin->diameter = 0.5f;
			pin->diameter = brd_pin.radius; // some format (.fz) contains a radius field

			pin->net->pins.push_back(pin);
			pins_.push_back(pin);
		}

		// remove all dummy components from vector, add our official dummy
		components_.erase(
		    remove_if(begin(components_), end(components_), [](std::shared_ptr<Component> &comp) { return comp->is_dummy(); }),
		    end(components_));

		components_.push_back(comp_dummy);
	}

	// Populate Net vector by using the map. (sorted by keys)
	for (auto &net : net_map) {
		// check whether the pin represents ground
		net.second->is_ground = (net.second->name == "GND" || net.second->name == "GROUND");
		nets_.push_back(net.second);
	}

	// Sort components by name
	sort(begin(components_), end(components_), [](const std::shared_ptr<Component> &lhs, const std::shared_ptr<Component> &rhs) {
		return lhs->name < rhs->name;
	});
}